

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

int Eso_ManComputeAnd(Eso_Man_t *p,Vec_Int_t *vCube1,Vec_Int_t *vCube2,Vec_Int_t *vCube)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  int *pBeg;
  Vec_Int_t *vCube_local;
  Vec_Int_t *vCube2_local;
  Vec_Int_t *vCube1_local;
  Eso_Man_t *p_local;
  
  pBeg1 = vCube->pArray;
  pBeg2 = vCube1->pArray;
  pEnd1 = vCube2->pArray;
  piVar2 = vCube1->pArray;
  iVar6 = vCube1->nSize;
  piVar3 = vCube2->pArray;
  iVar1 = vCube2->nSize;
  while (pBeg2 < piVar2 + iVar6 && pEnd1 < piVar3 + iVar1) {
    if (*pBeg2 == *pEnd1) {
      *pBeg1 = *pBeg2;
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
    }
    else {
      iVar4 = Abc_Lit2Var(*pBeg2);
      iVar5 = Abc_Lit2Var(*pEnd1);
      if (iVar4 == iVar5) {
        return -1;
      }
      if (*pBeg2 < *pEnd1) {
        *pBeg1 = *pBeg2;
        pBeg2 = pBeg2 + 1;
      }
      else {
        *pBeg1 = *pEnd1;
        pEnd1 = pEnd1 + 1;
      }
    }
    pBeg1 = pBeg1 + 1;
  }
  while (pBeg2 < piVar2 + iVar6) {
    *pBeg1 = *pBeg2;
    pBeg2 = pBeg2 + 1;
    pBeg1 = pBeg1 + 1;
  }
  while (pEnd1 < piVar3 + iVar1) {
    *pBeg1 = *pEnd1;
    pEnd1 = pEnd1 + 1;
    pBeg1 = pBeg1 + 1;
  }
  vCube->nSize = (int)((long)pBeg1 - (long)vCube->pArray >> 2);
  if (vCube->nSize <= vCube->nCap) {
    if (vCube->nSize < vCube1->nSize) {
      __assert_fail("vCube->nSize >= vCube1->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEsop.c"
                    ,0x195,
                    "int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (vCube2->nSize <= vCube->nSize) {
      iVar6 = Hsh_VecManAdd(p->pHash,vCube);
      return iVar6;
    }
    __assert_fail("vCube->nSize >= vCube2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEsop.c"
                  ,0x196,"int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  __assert_fail("vCube->nSize <= vCube->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEsop.c"
                ,0x194,"int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Eso_ManComputeAnd( Eso_Man_t * p, Vec_Int_t * vCube1, Vec_Int_t * vCube2, Vec_Int_t * vCube )
{
    int * pBeg  = vCube->pArray;
    int * pBeg1 = vCube1->pArray;
    int * pBeg2 = vCube2->pArray;
    int * pEnd1 = vCube1->pArray + vCube1->nSize;
    int * pEnd2 = vCube2->pArray + vCube2->nSize;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( Abc_Lit2Var(*pBeg1) == Abc_Lit2Var(*pBeg2) )
            return -1;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    vCube->nSize = pBeg - vCube->pArray;
    assert( vCube->nSize <= vCube->nCap );
    assert( vCube->nSize >= vCube1->nSize );
    assert( vCube->nSize >= vCube2->nSize );
    return Hsh_VecManAdd( p->pHash, vCube );
}